

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::EzRpcClient::Impl>::disposeImpl
          (HeapDisposer<capnp::EzRpcClient::Impl> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    capnp::EzRpcClient::Impl::~Impl((Impl *)pointer);
  }
  operator_delete(pointer,0x30);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }